

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardKinematics.cpp
# Opt level: O3

bool iDynTree::ForwardBiasAccKinematics
               (Model *model,Traversal *traversal,FreeFloatingPos *robotPos,
               FreeFloatingVel *robotVel,SpatialAcc *baseBiasAcc,LinkVelArray *linkVel,
               LinkAccArray *linkBiasAcc)

{
  uint uVar1;
  Link *this;
  Link *this_00;
  IJoint *pIVar2;
  JointPosDoubleArray *pJVar3;
  JointDOFsDoubleArray *pJVar4;
  LinkIndex LVar5;
  LinkIndex LVar6;
  SpatialAcc *this_01;
  ulong traversalIndex;
  
  uVar1 = Traversal::getNrOfVisitedLinks(traversal);
  if (uVar1 != 0) {
    traversalIndex = 0;
    do {
      this = Traversal::getLink(traversal,traversalIndex);
      this_00 = Traversal::getParentLink(traversal,traversalIndex);
      pIVar2 = Traversal::getParentJoint(traversal,traversalIndex);
      if (this_00 == (Link *)0x0) {
        LVar5 = Link::getIndex(this);
        this_01 = LinkAccArray::operator()(linkBiasAcc,LVar5);
        iDynTree::SpatialAcc::operator=(this_01,baseBiasAcc);
      }
      else {
        pJVar3 = FreeFloatingPos::jointPos(robotPos);
        pJVar4 = FreeFloatingVel::jointVel(robotVel);
        LVar5 = Link::getIndex(this);
        LVar6 = Link::getIndex(this_00);
        (*pIVar2->_vptr_IJoint[0x11])(pIVar2,pJVar3,pJVar4,linkVel,linkBiasAcc,LVar5,LVar6);
      }
      traversalIndex = traversalIndex + 1;
      uVar1 = Traversal::getNrOfVisitedLinks(traversal);
    } while (traversalIndex < uVar1);
  }
  return true;
}

Assistant:

bool ForwardBiasAccKinematics(const Model& model,
                              const Traversal& traversal,
                              const FreeFloatingPos & robotPos,
                              const FreeFloatingVel & robotVel,
                              const SpatialAcc& baseBiasAcc,
                              const LinkVelArray & linkVel,
                                    LinkAccArray & linkBiasAcc)
{
    bool retValue = true;

    for(unsigned int traversalEl=0; traversalEl < traversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = traversal.getLink(traversalEl);
        LinkConstPtr parentLink  = traversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = traversal.getParentJoint(traversalEl);

        if( parentLink == 0 )
        {
            // If the visited link is the base, the base has no parent.
            // In this case the bias acceleration is tipically zero,
            // or in strange cases the one specified by the baseBiasAcc argument
            linkBiasAcc(visitedLink->getIndex()) = baseBiasAcc;
        }
        else
        {
            // Otherwise we compute the child velocity and acceleration from parent
            toParentJoint->computeChildBiasAcc(robotPos.jointPos(),
                                               robotVel.jointVel(),
                                               linkVel, linkBiasAcc,
                                               visitedLink->getIndex(),
                                               parentLink->getIndex());
        }

    }

    return retValue;
}